

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O2

string * __thiscall
JointPolicyPureVectorForClusteredBG::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,JointPolicyPureVectorForClusteredBG *this)

{
  size_t sVar1;
  size_type __n;
  PlanningUnitDecPOMDPDiscrete *pu;
  long lVar2;
  element_type *peVar3;
  sp_counted_base *tmp;
  ostream *poVar4;
  Interface_ProblemToPolicyDiscretePure *pIVar5;
  reference ppJVar6;
  reference this_00;
  E *this_01;
  element_type *peVar7;
  element_type *peVar8;
  uint uVar9;
  Index ts;
  ulong uVar10;
  undefined1 local_258 [32];
  shared_ptr<const_BayesianGameWithClusterInfo> bg;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  bgVec;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  jpolBGVec;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_1e0;
  element_type *local_1c8;
  shared_count local_1c0;
  stringstream ss;
  ostream local_1a8 [376];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"JointPolicyPureVectorForClusteredBG:SoftPrint");
  std::endl<char,std::char_traits<char>>(poVar4);
  sVar1 = (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
          super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(local_1a8,"JointPolicyPureVectorForClusteredBG, depth ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (sVar1 == 0) {
    poVar4 = std::operator<<(local_1a8,"empty policy!");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
  }
  else {
    JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared((JointPolicyDiscretePure *)local_258)
    ;
    if ((element_type *)local_258._0_8_ == (element_type *)0x0) {
      pIVar5 = JointPolicyDiscretePure::GetInterfacePTPDiscretePure((JointPolicyDiscretePure *)this)
      ;
      boost::detail::shared_count::~shared_count((shared_count *)(local_258 + 8));
      if (pIVar5 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
        this_01 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_01,
             "JointPolicyPureVectorForClusteredBG:SoftPrint - Error!!! PTPDP==0, but depth>0");
        __cxa_throw(this_01,&E::typeinfo,E::~E);
      }
    }
    else {
      boost::detail::shared_count::~shared_count((shared_count *)(local_258 + 8));
    }
    poVar4 = std::operator<<(local_1a8,
                             "Improve printing this (clustered) policy..., the below still takes exponential space... "
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    __n = (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
          super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
    pu = (((this->_m_bg).px)->super_BayesianGameForDecPOMDPStage)._m_pu;
    bg.px = (element_type *)0x0;
    bg.pn.pi_ = (sp_counted_base *)0x0;
    std::vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>::
    vector(&jpolBGVec,__n,(allocator_type *)local_258);
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::vector(&bgVec,__n,(allocator_type *)local_258);
    uVar10 = 0;
    uVar9 = 0;
    peVar7 = (element_type *)this;
    while( true ) {
      ts = (Index)uVar10;
      if (__n <= uVar9) break;
      local_258._0_8_ =
           (peVar7->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
           super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_jointToIndTypesMap;
      local_258._8_8_ =
           *(undefined8 *)
            &(peVar7->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
             super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_initialized;
      lVar2 = *(long *)&(peVar7->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface
                        .super_BayesianGameBase._m_initialized;
      if (lVar2 != 0) {
        LOCK();
        lVar2 = lVar2 + 8;
        *(int *)lVar2 = *(int *)lVar2 + 1;
        UNLOCK();
      }
      uVar10 = ~(ulong)uVar9 + __n;
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
                (&bg,(shared_ptr<const_BayesianGameWithClusterInfo> *)local_258);
      boost::detail::shared_count::~shared_count((shared_count *)(local_258 + 8));
      ts = (Index)uVar10;
      ppJVar6 = std::
                vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                ::at(&jpolBGVec,uVar10 & 0xffffffff);
      *ppJVar6 = (value_type)peVar7;
      this_00 = std::
                vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                ::at(&bgVec,uVar10 & 0xffffffff);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(this_00,&bg);
      peVar8 = peVar7;
      if (ts != 0) {
        peVar8 = (element_type *)
                 (peVar7->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                 super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrAgents;
        local_258._8_8_ =
             (peVar7->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
             super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrActions.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((sp_counted_base *)local_258._8_8_ != (sp_counted_base *)0x0) {
          LOCK();
          ((sp_counted_base *)local_258._8_8_)->use_count_ =
               ((sp_counted_base *)local_258._8_8_)->use_count_ + 1;
          UNLOCK();
        }
        local_258._0_8_ = peVar8;
        boost::detail::shared_count::~shared_count((shared_count *)(local_258 + 8));
        if (peVar8 == (element_type *)0x0) {
          peVar3 = ((bg.px)->super_BayesianGameForDecPOMDPStage).
                   super_BayesianGameForDecPOMDPStageInterface._m_pJPol.px;
          local_1c0.pi_ =
               ((bg.px)->super_BayesianGameForDecPOMDPStage).
               super_BayesianGameForDecPOMDPStageInterface._m_pJPol.pn.pi_;
          if (local_1c0.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (local_1c0.pi_)->use_count_ = (local_1c0.pi_)->use_count_ + 1;
            UNLOCK();
          }
          local_258._0_8_ = (element_type *)0x0;
          local_258._8_8_ = (sp_counted_base *)0x0;
          local_1c8 = peVar3;
          boost::detail::shared_count::~shared_count((shared_count *)(local_258 + 8));
          if (peVar3 == (element_type *)0x0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     "JointPolicyPureVectorForClusteredBG::SoftPrint");
            poVar4 = std::operator<<(poVar4," t=");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4,", but no past joint policy? (jp ==0)");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          else {
            poVar4 = std::operator<<(local_1a8,"The following joint policy was used for stages 0..."
                                    );
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4," :");
            std::endl<char,std::char_traits<char>>(poVar4);
            (*(local_1c8->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy
              ._vptr_JointPolicy[6])(local_258);
            std::operator<<(local_1a8,(string *)local_258);
            std::__cxx11::string::~string((string *)local_258);
          }
          boost::detail::shared_count::~shared_count(&local_1c0);
          break;
        }
      }
      uVar9 = uVar9 + 1;
      peVar7 = peVar8;
    }
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::vector(&local_1e0,&bgVec);
    StartRecursiveSoftPrintPerAgent(this,pu,&ss,ts,(int)__n - 1,&jpolBGVec,&local_1e0);
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::~vector(&local_1e0);
    std::__cxx11::stringbuf::str();
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::~vector(&bgVec);
    std::
    _Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
    ::~_Vector_base(&jpolBGVec.
                     super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                   );
    boost::detail::shared_count::~shared_count(&bg.pn);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string JointPolicyPureVectorForClusteredBG::SoftPrint() const
{
    cout << "JointPolicyPureVectorForClusteredBG:SoftPrint"<<endl;
    size_t depth = GetDepth();
    stringstream ss;
    ss << "JointPolicyPureVectorForClusteredBG, depth " 
       << GetDepth() << endl;
    if(depth == 0)
    {
        ss << "empty policy!"<< endl;
        return(ss.str());
    }

    if(JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared() == 0 &&
       JointPolicyDiscretePure::GetInterfacePTPDiscretePure() == 0)
        throw E("JointPolicyPureVectorForClusteredBG:SoftPrint - Error!!! PTPDP==0, but depth>0");
            
    ss << "Improve printing this (clustered) policy..., the below still takes exponential space... "<<endl;
/*    for(
            Index agentI = 0; 
            agentI <    static_cast< vector<PolicyPureVector*>::size_type> 
                            (PTPDP->GetNrAgents());
            agentI++
        )
    {
        ss << "Policy for agent " << agentI << " (index "
           << _m_policyPointerVector.at(agentI)->GetIndex() << "):" << endl
           << _m_policyPointerVector.at(agentI)->SoftPrint();
    }
*/    
    const PlanningUnitDecPOMDPDiscrete* pu = _m_bg->GetPUDecPOMDPDiscrete();
    size_t h = this->GetDepth();//pu->GetHorizon();
//     JPPVfCBG_constPtr jpolBG = 
//         JPPVfCBG_constPtr(new JointPolicyPureVectorForClusteredBG(*this));
    const JointPolicyPureVectorForClusteredBG *jpolBG=this;
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg;
    vector<const JointPolicyDiscretePure* > jpolBGVec(h);
    vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec(h);
    Index t=0;
    //for(t=h-1; t >= 0; t--) //<- this never terminates (t is unsigned)
    for(Index t_inv = 0; t_inv < h; t_inv++)
    {
        t = h - 1 - t_inv;
        bg =  jpolBG->GetBG();
        jpolBGVec.at(t) = jpolBG;
        bgVec.at(t) = bg;

        if( t > 0  )
        {
            jpolBG = jpolBG->GetPrevJPPVfCBG().get();
            if(jpolBG == 0)
            {
                //apparently for stages 0...t a different type of policy is used
                //we get it from the BG:
                boost::shared_ptr<const JointPolicyDiscretePure> jp = bg->GetPastJointPolicy();
                if(jp != 0)
                {
                    ss << "The following joint policy was used for stages 0..."
                        << t << " :"<< endl;
                    ss << jp->SoftPrint();
                }
                else
                {
                    cerr << "JointPolicyPureVectorForClusteredBG::SoftPrint"
                       <<" t="<<t<<", but no past joint policy? (jp ==0)"<<endl;

                }
                break;
            }

        }
    }
#if DEBUG_RECURSIVE_SPRINT
    cout << ">>>About to start StartRecursiveSoftPrintPerAgent..."<<endl;
#endif
    StartRecursiveSoftPrintPerAgent(pu, ss, t, h-1, jpolBGVec, bgVec);
    return(ss.str());
}